

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4_gzip_rpm.c
# Opt level: O0

void test_read_format_cpio_svr4_gzip_rpm(void)

{
  wchar_t line;
  archive_entry *paVar1;
  void *unaff_retaddr;
  void *in_stack_00000010;
  wchar_t in_stack_00000018;
  int r;
  char *name;
  archive *a;
  archive_entry *ae;
  char *in_stack_000003e0;
  void *in_stack_ffffffffffffffc8;
  archive_entry *paVar2;
  archive_entry **ppaVar3;
  int n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffd4;
  wchar_t in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *file;
  archive_entry *in_stack_fffffffffffffff8;
  
  file = "test_read_format_cpio_svr4_gzip_rpm.rpm";
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  line = archive_read_support_filter_gzip
                   ((archive *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (line == L'\xffffffec') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_gzip_rpm.c"
                   ,L'_');
    test_skipping("gzip reading not fully supported on this platform");
    archive_read_free((archive *)0x177bf1);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),0,
                        (char *)0x177c1f,unaff_retaddr);
  }
  else {
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (longlong)paVar1,(char *)0x177c55,unaff_retaddr);
    archive_read_support_filter_rpm
              ((archive *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    paVar2 = paVar1;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (longlong)paVar1,(char *)0x177c8e,unaff_retaddr);
    archive_read_support_format_all((archive *)paVar1);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (longlong)paVar2,(char *)0x177cc7,unaff_retaddr);
    extract_reference_file(in_stack_000003e0);
    archive_read_open_filename
              ((archive *)CONCAT44(line,in_stack_ffffffffffffffe0),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    paVar1 = paVar2;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (longlong)paVar2,(char *)0x177d14,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (archive_entry **)paVar2);
    paVar2 = paVar1;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        (longlong)paVar1,(char *)0x177d52,unaff_retaddr);
    archive_entry_pathname(paVar1);
    uVar4 = 0;
    assertion_equal_string
              ((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),file,
               (char *)CONCAT44(line,in_stack_ffffffffffffffe0),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),in_stack_00000010,
               in_stack_00000018);
    archive_entry_mtime(in_stack_fffffffffffffff8);
    ppaVar3 = (archive_entry **)0x0;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x177dd4,
                        unaff_retaddr);
    archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),ppaVar3);
    paVar1 = paVar2;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar2,
                        (char *)0x177e12,unaff_retaddr);
    archive_entry_pathname(paVar2);
    uVar4 = 0;
    assertion_equal_string
              ((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar1 >> 0x20),file,
               (char *)CONCAT44(line,in_stack_ffffffffffffffe0),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),in_stack_00000010,
               in_stack_00000018);
    archive_entry_mtime(in_stack_fffffffffffffff8);
    ppaVar3 = (archive_entry **)0x0;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x177e94,
                        unaff_retaddr);
    archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),ppaVar3);
    paVar2 = paVar1;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar1,
                        (char *)0x177ed2,unaff_retaddr);
    archive_entry_pathname(paVar1);
    uVar4 = 0;
    assertion_equal_string
              ((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),file,
               (char *)CONCAT44(line,in_stack_ffffffffffffffe0),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),in_stack_00000010,
               in_stack_00000018);
    archive_entry_mtime(in_stack_fffffffffffffff8);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x177f54,
                        unaff_retaddr);
    archive_entry_is_encrypted(in_stack_fffffffffffffff8);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x177f8d,
                        unaff_retaddr);
    archive_read_has_encrypted_entries
              ((archive *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    paVar1 = paVar2;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar2,
                        (char *)0x177fc9,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(archive_entry **)paVar2);
    paVar2 = paVar1;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar1,
                        (char *)0x178008,unaff_retaddr);
    archive_filter_code((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),
                        (int)((ulong)paVar1 >> 0x20));
    n = 0;
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x178046,
                        unaff_retaddr);
    archive_filter_name((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),n);
    uVar4 = 0;
    assertion_equal_string
              ((char *)in_stack_fffffffffffffff8,(wchar_t)((ulong)paVar2 >> 0x20),file,
               (char *)CONCAT44(line,in_stack_ffffffffffffffe0),
               (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),in_stack_00000010,
               in_stack_00000018);
    archive_format((archive *)paVar2);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x1780cb,
                        unaff_retaddr);
    archive_read_close((archive *)0x1780d5);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x178103,
                        unaff_retaddr);
    archive_read_free((archive *)0x17810d);
    assertion_equal_int(file,line,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x17813b,
                        unaff_retaddr);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4_gzip_rpm)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_cpio_svr4_gzip_rpm.rpm";
	int r;

	assert((a = archive_read_new()) != NULL);
        r = archive_read_support_filter_gzip(a);
	if (r == ARCHIVE_WARN) {
		skipping("gzip reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
        }
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_rpm(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file1", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file2", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file3", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
  
	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_GZIP);
	assertEqualString(archive_filter_name(a, 0), "gzip");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_SVR4_NOCRC);
 
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}